

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparcDisassembler.c
# Opt level: O1

_Bool Sparc_getInstruction
                (csh ud,uint8_t *code,size_t code_len,MCInst *MI,uint16_t *size,uint64_t address,
                void *info)

{
  byte bVar1;
  cs_detail *__s;
  uint uVar2;
  uint uVar4;
  uint uVar5;
  long lVar6;
  uint8_t *puVar7;
  DecodeStatus DVar8;
  uint8_t *orig_p;
  uint *puVar9;
  byte bVar10;
  void *Decoder;
  long lVar11;
  uint64_t Address;
  uint64_t Value;
  ulong uVar12;
  ulong uVar13;
  uint uVar14;
  uint64_t Value_4;
  uint uVar15;
  _Bool _Var16;
  code *DecodeRD;
  uint uVar17;
  uint8_t *orig_p_2;
  uint8_t *puVar18;
  long lVar19;
  byte *pbVar20;
  int iVar21;
  uint uVar22;
  uint uVar23;
  DecodeStatus S;
  int local_44;
  uint uVar3;
  
  if (3 < code_len) {
    uVar23 = *(uint *)code;
    uVar2 = uVar23 >> 0x18;
    uVar4 = (uVar23 & 0xff0000) >> 8;
    uVar3 = uVar2 | uVar4;
    uVar5 = (uVar23 & 0xff00) << 8;
    uVar15 = uVar3 | uVar5;
    uVar23 = uVar23 << 0x18;
    uVar22 = uVar15 | uVar23;
    __s = MI->flat_insn->detail;
    if (__s != (cs_detail *)0x0) {
      memset(__s,0,0xa8);
    }
    uVar17 = 0;
    local_44 = 3;
    puVar7 = "\x01\x1e\x02\x02";
LAB_00241ec6:
    puVar18 = puVar7;
    switch(*puVar18) {
    case '\x01':
      uVar17 = ~(-1 << (puVar18[2] & 0x1f)) << (puVar18[1] & 0x1f);
      if (puVar18[2] == 0x20) {
        uVar17 = 0xffffffff;
      }
      uVar17 = (uVar17 & uVar22) >> (puVar18[1] & 0x1f);
      puVar7 = puVar18 + 3;
      goto LAB_00241ec6;
    case '\x02':
      uVar12 = 0;
      lVar11 = 0;
      bVar10 = 0;
      do {
        lVar19 = uVar12 + 1;
        lVar11 = lVar11 + ((ulong)(puVar18[lVar19] & 0x7f) << (bVar10 & 0x3f));
        bVar10 = bVar10 + 7;
        uVar12 = uVar12 + 1;
      } while ((char)puVar18[lVar19] < '\0');
      puVar7 = puVar18 + (uVar12 & 0xffffffff) + 3;
      if (uVar17 != (uint)lVar11) {
        puVar7 = puVar18 + (uVar12 & 0xffffffff) + 3 +
                 *(ushort *)(puVar18 + (uVar12 & 0xffffffff) + 1);
      }
      goto LAB_00241ec6;
    case '\x03':
      uVar14 = ~(-1 << (puVar18[2] & 0x1f)) << (puVar18[1] & 0x1f);
      if (puVar18[2] == 0x20) {
        uVar14 = 0xffffffff;
      }
      uVar12 = 0;
      lVar11 = 0;
      bVar10 = 0;
      do {
        lVar19 = uVar12 + 3;
        lVar11 = lVar11 + ((ulong)(puVar18[lVar19] & 0x7f) << (bVar10 & 0x3f));
        bVar10 = bVar10 + 7;
        uVar12 = uVar12 + 1;
      } while ((char)puVar18[lVar19] < '\0');
      puVar7 = puVar18 + (uVar12 & 0xffffffff) + 5;
      if ((uVar14 & uVar22) >> (puVar18[1] & 0x1f) != (uint)lVar11) {
        puVar7 = puVar18 + (uVar12 & 0xffffffff) + 5 +
                 *(ushort *)(puVar18 + (uVar12 & 0xffffffff) + 3);
      }
      goto LAB_00241ec6;
    case '\x04':
      uVar12 = 0;
      do {
        lVar11 = uVar12 + 1;
        uVar12 = uVar12 + 1;
      } while ((char)puVar18[lVar11] < '\0');
      puVar7 = puVar18 + (uVar12 & 0xffffffff) + 3;
      goto LAB_00241ec6;
    case '\x05':
      goto switchD_00241edc_caseD_5;
    case '\x06':
      uVar12 = 0;
      lVar11 = 0;
      bVar10 = 0;
      do {
        lVar19 = uVar12 + 1;
        lVar11 = lVar11 + ((ulong)(puVar18[lVar19] & 0x7f) << (bVar10 & 0x3f));
        bVar10 = bVar10 + 7;
        uVar12 = uVar12 + 1;
      } while ((char)puVar18[lVar19] < '\0');
      uVar13 = 0;
      lVar19 = 0;
      bVar10 = 0;
      do {
        lVar6 = uVar13 + (uVar12 & 0xffffffff) + 1;
        lVar19 = lVar19 + ((ulong)(puVar18[lVar6] & 0x7f) << (bVar10 & 0x3f));
        bVar10 = bVar10 + 7;
        uVar13 = uVar13 + 1;
      } while ((char)puVar18[lVar6] < '\0');
      puVar7 = puVar18 + (uVar13 & 0xffffffff) + (uVar12 & 0xffffffff) + 1;
      if (((uint)lVar19 & ~uVar22) != 0 || ((uint)lVar11 & uVar22) != 0) {
        local_44 = 1;
      }
      goto LAB_00241ec6;
    default:
      goto switchD_00241edc_default;
    }
  }
  goto LAB_00242b25;
switchD_00241edc_caseD_5:
  uVar12 = 0;
  lVar11 = 0;
  bVar10 = 0;
  do {
    lVar19 = uVar12 + 1;
    lVar11 = lVar11 + ((ulong)(puVar18[lVar19] & 0x7f) << (bVar10 & 0x3f));
    bVar10 = bVar10 + 7;
    uVar12 = uVar12 + 1;
  } while ((char)puVar18[lVar19] < '\0');
  pbVar20 = puVar18 + (uVar12 & 0xffffffff) + 1;
  lVar19 = 0;
  bVar10 = 0;
  do {
    bVar1 = *pbVar20;
    lVar19 = lVar19 + ((ulong)(bVar1 & 0x7f) << (bVar10 & 0x3f));
    bVar10 = bVar10 + 7;
    pbVar20 = pbVar20 + 1;
  } while ((char)bVar1 < '\0');
  MCInst_setOpcode(MI,(uint)lVar11);
  uVar17 = (int)lVar19 - 1;
  if (0x45 < uVar17) {
    uVar12 = (ulong)(uVar3 | uVar5 & 0x3fffff);
    goto LAB_00242abf;
  }
  Decoder = (void *)((long)&switchD_002420c0::switchdataD_00541628 +
                    (long)(int)(&switchD_002420c0::switchdataD_00541628)[uVar17]);
  switch((int)lVar19) {
  case 1:
    uVar5 = uVar5 & 0x7ffff;
    goto LAB_002424cc;
  case 2:
    uVar5 = uVar5 & 0x3fffff;
LAB_002424cc:
    uVar12 = (ulong)(uVar3 | uVar5);
LAB_002424d1:
    MCOperand_CreateImm0(MI,uVar12);
    uVar23 = uVar23 >> 0x19;
LAB_002427a3:
    uVar12 = (ulong)(uVar23 & 0xf);
    break;
  case 3:
    MCOperand_CreateReg0
              (MI,*(uint *)((long)IntRegDecoderTable + (ulong)((uVar15 & 0x7c000) >> 0xc)));
    uVar12 = (ulong)((uVar5 & 0x300000) >> 6 | uVar2 | uVar4 & 0x3fff);
    break;
  case 4:
    goto switchD_002420c0_caseD_4;
  case 5:
    MCOperand_CreateReg0
              (MI,*(uint *)((long)IntRegDecoderTable + (ulong)((uVar23 & 0x3e000000) >> 0x17)));
    uVar12 = (ulong)(uVar3 | uVar5 & 0x3fffff);
    break;
  case 6:
    MCOperand_CreateImm0(MI,(ulong)(uVar3 | uVar5 & 0x7ffff));
    MCOperand_CreateImm0(MI,(ulong)(uVar23 >> 0x19 & 0xf));
    uVar23 = *(uint *)((long)FCCRegDecoderTable + (ulong)((uVar5 & 0x300000) >> 0x12));
    goto LAB_00242b08;
  case 7:
    uVar12 = (ulong)(uVar22 << 2);
    break;
  default:
    uVar12 = (ulong)((uVar23 & 0x3e000000) >> 0x17);
    puVar9 = IntRegDecoderTable;
    goto LAB_00242998;
  case 9:
    MCOperand_CreateReg0
              (MI,*(uint *)((long)IntRegDecoderTable + (ulong)((uVar23 & 0x3e000000) >> 0x17)));
    MCOperand_CreateReg0
              (MI,*(uint *)((long)IntRegDecoderTable + (ulong)((uVar15 & 0x7c000) >> 0xc)));
    uVar12 = (ulong)(uint)((int)(uVar3 << 0x13) >> 0x13);
    break;
  case 0xb:
    MCOperand_CreateReg0
              (MI,*(uint *)((long)IntRegDecoderTable + (ulong)((uVar23 & 0x3e000000) >> 0x17)));
    MCOperand_CreateReg0
              (MI,*(uint *)((long)IntRegDecoderTable + (ulong)((uVar15 & 0x7c000) >> 0xc)));
    uVar12 = (ulong)(uVar2 | uVar4 & 0x1fff);
    break;
  case 0xc:
    uVar22 = uVar22 >> 0xc;
    goto LAB_00242410;
  case 0xd:
    MCOperand_CreateReg0
              (MI,*(uint *)((long)IntRegDecoderTable + (ulong)((uVar15 & 0x7c000) >> 0xc)));
    uVar12 = (ulong)(uint)((int)(uVar3 << 0x13) >> 0x13);
    break;
  case 0xf:
    MCOperand_CreateReg0
              (MI,*(uint *)((long)IntRegDecoderTable + (ulong)((uVar23 & 0x3e000000) >> 0x17)));
    MCOperand_CreateReg0
              (MI,*(uint *)((long)IntRegDecoderTable + (ulong)((uVar15 & 0x7c000) >> 0xc)));
    uVar12 = (ulong)(uVar2 & 0x3f);
    break;
  case 0x10:
    uVar12 = (ulong)(uint)((int)(uVar3 << 0x13) >> 0x13);
    break;
  case 0x11:
    uVar12 = (ulong)((uVar23 & 0x3e000000) >> 0x17);
    puVar9 = IntRegDecoderTable;
    goto LAB_00242735;
  case 0x12:
    uVar12 = (ulong)((uVar23 & 0x3e000000) >> 0x17);
    puVar9 = IntRegDecoderTable;
    goto LAB_00242930;
  case 0x13:
    uVar23 = *(uint *)((long)IntRegDecoderTable + (ulong)((uVar23 & 0x3e000000) >> 0x17));
    uVar15 = uVar23;
    goto LAB_0024277f;
  case 0x14:
    uVar23 = *(uint *)((long)IntRegDecoderTable + (ulong)((uVar23 & 0x3e000000) >> 0x17));
    MCOperand_CreateReg0(MI,uVar23);
    uVar15 = *(uint *)((long)FCCRegDecoderTable + (ulong)((uVar4 & 0x1800) >> 9));
LAB_0024277f:
    MCOperand_CreateReg0(MI,uVar15);
    MCOperand_CreateImm0(MI,(ulong)(uVar2 | uVar4 & 0x7ff));
    MCOperand_CreateReg0(MI,uVar23);
    uVar23 = uVar22 >> 0xe;
    goto LAB_002427a3;
  case 0x15:
  case 0x2f:
    uVar22 = uVar22 >> 0x17;
LAB_00242410:
    uVar12 = (ulong)(uVar22 & 0x7c);
    puVar9 = IntRegDecoderTable;
    goto LAB_00242894;
  case 0x16:
    MCOperand_CreateReg0
              (MI,*(uint *)((long)IntRegDecoderTable + (ulong)((uVar23 & 0x3e000000) >> 0x17)));
    MCOperand_CreateReg0
              (MI,*(uint *)((long)IntRegDecoderTable + (ulong)((uVar15 & 0x7c000) >> 0xc)));
    uVar12 = (ulong)(uVar2 | uVar4 & 0x3ff);
    break;
  case 0x17:
    uVar12 = (ulong)((uVar23 & 0x3e000000) >> 0x17);
    puVar9 = FPRegDecoderTable;
    goto LAB_00242894;
  case 0x18:
    uVar12 = (ulong)((uVar23 & 0x3e000000) >> 0x17);
    puVar9 = DFPRegDecoderTable;
LAB_00242894:
    uVar23 = *(uint *)(uVar12 + (long)puVar9);
    goto LAB_00242af5;
  case 0x19:
    uVar23 = uVar23 >> 0x19 & 0x1f;
    iVar21 = 0;
    if ((0xccccccccU >> uVar23 & 1) == 0) {
      uVar23 = QFPRegDecoderTable[uVar23];
LAB_00242a65:
      MCOperand_CreateReg0(MI,uVar23);
      iVar21 = 0;
      if ((0xccccccccU >> (uVar2 & 0x1f) & 1) == 0) {
        uVar23 = QFPRegDecoderTable[uVar2 & 0x1f];
        goto LAB_00242b08;
      }
    }
    goto LAB_00242b12;
  case 0x1a:
    uVar12 = (ulong)((uVar23 & 0x3e000000) >> 0x17);
    puVar9 = FPRegDecoderTable;
    goto LAB_00242998;
  case 0x1b:
    uVar12 = (ulong)((uVar23 & 0x3e000000) >> 0x17);
    puVar9 = DFPRegDecoderTable;
LAB_00242998:
    MCOperand_CreateReg0(MI,*(uint *)(uVar12 + (long)puVar9));
    uVar12 = (ulong)((uVar15 & 0x7c000) >> 0xc);
LAB_00242af2:
    uVar23 = *(uint *)(uVar12 + (long)puVar9);
LAB_00242af5:
    MCOperand_CreateReg0(MI,uVar23);
    uVar23 = puVar9[uVar2 & 0x1f];
    goto LAB_00242b08;
  case 0x1c:
    uVar23 = uVar23 >> 0x19 & 0x1f;
    iVar21 = 0;
    if ((0xccccccccU >> uVar23 & 1) == 0) {
      MCOperand_CreateReg0(MI,QFPRegDecoderTable[uVar23]);
joined_r0x00242a53:
      uVar23 = (uVar15 & 0x7c000) >> 0xe;
      iVar21 = 0;
      if ((0xccccccccU >> uVar23 & 1) == 0) {
        uVar23 = QFPRegDecoderTable[uVar23];
        goto LAB_00242a65;
      }
    }
    goto LAB_00242b12;
  case 0x1d:
    uVar23 = *(uint *)((long)DFPRegDecoderTable + (ulong)((uVar23 & 0x3e000000) >> 0x17));
    goto LAB_002428fe;
  case 0x1e:
    uVar23 = uVar23 >> 0x19 & 0x1f;
    if ((0xccccccccU >> uVar23 & 1) == 0) {
      puVar9 = QFPRegDecoderTable;
LAB_00242ad2:
      uVar23 = puVar9[uVar23];
      goto LAB_00242ad5;
    }
    goto switchD_00241edc_default;
  case 0x1f:
    uVar23 = *(uint *)((long)DFPRegDecoderTable + (ulong)((uVar23 & 0x3e000000) >> 0x17));
LAB_002424f5:
    MCOperand_CreateReg0(MI,uVar23);
    uVar12 = (ulong)(uVar2 & 0x1f);
    puVar9 = FPRegDecoderTable;
    goto LAB_002429e1;
  case 0x20:
    puVar9 = DFPRegDecoderTable;
    goto LAB_002426a0;
  case 0x21:
    puVar9 = FPRegDecoderTable;
    goto LAB_002422e4;
  case 0x22:
    uVar23 = uVar23 >> 0x19 & 0x1f;
    if ((0xccccccccU >> uVar23 & 1) != 0) goto switchD_00241edc_default;
    uVar23 = QFPRegDecoderTable[uVar23];
    goto LAB_002422e7;
  case 0x23:
    puVar9 = FPRegDecoderTable;
LAB_002426a0:
    MCOperand_CreateReg0(MI,*(uint *)((ulong)((uVar23 & 0x3e000000) >> 0x17) + (long)puVar9));
    uVar12 = (ulong)(uVar2 & 0x1f);
    if ((0xccccccccU >> (uVar2 & 0x1f) & 1) == 0) {
      puVar9 = QFPRegDecoderTable;
      goto LAB_002429e1;
    }
    goto switchD_00241edc_default;
  case 0x24:
    uVar23 = uVar23 >> 0x19 & 0x1f;
    if ((0xccccccccU >> uVar23 & 1) == 0) {
      uVar23 = QFPRegDecoderTable[uVar23];
      goto LAB_002424f5;
    }
    goto switchD_00241edc_default;
  case 0x25:
    uVar12 = (ulong)((uVar23 & 0x3e000000) >> 0x17);
    puVar9 = FPRegDecoderTable;
    goto LAB_00242735;
  case 0x26:
    uVar12 = (ulong)((uVar23 & 0x3e000000) >> 0x17);
    puVar9 = FPRegDecoderTable;
    goto LAB_00242930;
  case 0x27:
    uVar12 = (ulong)((uVar23 & 0x3e000000) >> 0x17);
    puVar9 = DFPRegDecoderTable;
LAB_00242735:
    uVar23 = *(uint *)(uVar12 + (long)puVar9);
    uVar15 = uVar23;
LAB_00242958:
    MCOperand_CreateReg0(MI,uVar15);
    uVar15 = puVar9[uVar2 & 0x1f];
LAB_00242966:
    MCOperand_CreateReg0(MI,uVar15);
    MCOperand_CreateReg0(MI,uVar23);
    uVar23 = uVar22 >> 0xe;
LAB_0024297c:
    uVar12 = (ulong)(uVar23 & 0xf);
    break;
  case 0x28:
    uVar12 = (ulong)((uVar23 & 0x3e000000) >> 0x17);
    puVar9 = DFPRegDecoderTable;
LAB_00242930:
    uVar23 = *(uint *)(uVar12 + (long)puVar9);
    MCOperand_CreateReg0(MI,uVar23);
    uVar15 = *(uint *)((long)FCCRegDecoderTable + (ulong)((uVar4 & 0x1800) >> 9));
    goto LAB_00242958;
  case 0x29:
    uVar23 = uVar23 >> 0x19 & 0x1f;
    iVar21 = 0;
    if ((0xccccccccU >> uVar23 & 1) != 0) goto LAB_00242b12;
    uVar23 = QFPRegDecoderTable[uVar23];
    uVar15 = uVar23;
LAB_00242834:
    MCOperand_CreateReg0(MI,uVar15);
    iVar21 = 0;
    if ((0xccccccccU >> (uVar2 & 0x1f) & 1) != 0) goto LAB_00242b12;
    uVar15 = QFPRegDecoderTable[uVar2 & 0x1f];
    goto LAB_00242966;
  case 0x2a:
    uVar23 = uVar23 >> 0x19 & 0x1f;
    iVar21 = 0;
    if ((0xccccccccU >> uVar23 & 1) == 0) {
      uVar23 = QFPRegDecoderTable[uVar23];
      MCOperand_CreateReg0(MI,uVar23);
      uVar15 = *(uint *)((long)FCCRegDecoderTable + (ulong)((uVar4 & 0x1800) >> 9));
      goto LAB_00242834;
    }
    goto LAB_00242b12;
  case 0x2b:
    puVar9 = FPRegDecoderTable;
    MCOperand_CreateReg0
              (MI,*(uint *)((long)FPRegDecoderTable + (ulong)((uVar23 & 0x3e000000) >> 0x17)));
    uVar23 = *(uint *)((long)IntRegDecoderTable + (ulong)((uVar15 & 0x7c000) >> 0xc));
    goto LAB_00242af5;
  case 0x2c:
    uVar23 = uVar23 >> 0x19 & 0x1f;
    if (3 < uVar23) goto switchD_00241edc_default;
    uVar23 = FCCRegDecoderTable[uVar23];
LAB_002428fe:
    MCOperand_CreateReg0(MI,uVar23);
    uVar12 = (ulong)((uVar15 & 0x7c000) >> 0xc);
    puVar9 = FPRegDecoderTable;
    goto LAB_00242af2;
  case 0x2d:
    uVar23 = uVar23 >> 0x19 & 0x1f;
    if (uVar23 < 4) {
      puVar9 = FCCRegDecoderTable;
      goto LAB_00242ad2;
    }
switchD_00241edc_default:
    iVar21 = 0;
    goto LAB_00242b12;
  case 0x2e:
    uVar23 = uVar23 >> 0x19 & 0x1f;
    iVar21 = 0;
    if (uVar23 < 4) {
      MCOperand_CreateReg0(MI,FCCRegDecoderTable[uVar23]);
      goto joined_r0x00242a53;
    }
    goto LAB_00242b12;
  case 0x30:
    uVar23 = IntRegDecoderTable[uVar2 & 0x1f];
    goto LAB_00242b08;
  case 0x31:
    uVar23 = *(uint *)((long)IntRegDecoderTable + (ulong)((uVar23 & 0x3e000000) >> 0x17));
LAB_00242ad5:
    MCOperand_CreateReg0(MI,uVar23);
    uVar12 = (ulong)((uVar15 & 0x7c000) >> 0xc);
    puVar9 = DFPRegDecoderTable;
    goto LAB_00242af2;
  case 0x32:
    puVar9 = DFPRegDecoderTable;
    goto LAB_002423c0;
  case 0x33:
    puVar9 = FPRegDecoderTable;
LAB_002423c0:
    uVar23 = *(uint *)((ulong)((uVar23 & 0x3e000000) >> 0x17) + (long)puVar9);
    MCOperand_CreateReg0(MI,uVar23);
    goto LAB_00242b08;
  case 0x34:
    puVar9 = DFPRegDecoderTable;
    goto LAB_00242a95;
  case 0x35:
    puVar9 = FPRegDecoderTable;
LAB_00242a95:
    MCOperand_CreateReg0(MI,*(uint *)((ulong)((uVar23 & 0x3e000000) >> 0x17) + (long)puVar9));
    uVar23 = *(uint *)((ulong)((uVar15 & 0x7c000) >> 0xc) + (long)puVar9);
    goto LAB_00242b08;
  case 0x36:
    puVar9 = IntRegDecoderTable;
LAB_002422e4:
    uVar23 = *(uint *)((ulong)((uVar23 & 0x3e000000) >> 0x17) + (long)puVar9);
LAB_002422e7:
    MCOperand_CreateReg0(MI,uVar23);
    uVar12 = (ulong)(uVar2 & 0x1f);
    puVar9 = DFPRegDecoderTable;
    goto LAB_002429e1;
  case 0x37:
    MCOperand_CreateReg0
              (MI,*(uint *)((long)DFPRegDecoderTable + (ulong)((uVar23 & 0x3e000000) >> 0x17)));
    uVar12 = (ulong)(uVar2 & 0x1f);
    puVar9 = IntRegDecoderTable;
LAB_002429e1:
    uVar23 = puVar9[uVar12];
    goto LAB_00242b08;
  case 0x38:
    DVar8 = DecodeJMPL(MI,uVar22,Address,Decoder);
    goto LAB_00242874;
  case 0x39:
    DVar8 = DecodeReturn(MI,uVar22,Address,Decoder);
    goto LAB_00242874;
  case 0x3a:
    MCOperand_CreateReg0
              (MI,*(uint *)((long)IntRegDecoderTable + (ulong)((uVar15 & 0x7c000) >> 0xc)));
    MCOperand_CreateReg0(MI,IntRegDecoderTable[uVar2 & 0x1f]);
    uVar23 = uVar23 >> 0x19;
    goto LAB_0024297c;
  case 0x3b:
    MCOperand_CreateReg0
              (MI,*(uint *)((long)IntRegDecoderTable + (ulong)((uVar15 & 0x7c000) >> 0xc)));
    uVar12 = (ulong)uVar22 & 0xff;
    goto LAB_002424d1;
  case 0x3c:
    DecodeRD = DecodeIntRegsRegisterClass;
    goto LAB_00242859;
  case 0x3d:
    DecodeRD = DecodeIntRegsRegisterClass;
    goto LAB_002425bd;
  case 0x3e:
    DVar8 = DecodeSWAP(MI,uVar22,Address,Decoder);
    goto LAB_00242874;
  case 0x3f:
    DecodeRD = DecodeFPRegsRegisterClass;
    goto LAB_00242859;
  case 0x40:
    DecodeRD = DecodeQFPRegsRegisterClass;
    goto LAB_00242859;
  case 0x41:
    DecodeRD = DecodeDFPRegsRegisterClass;
LAB_00242859:
    _Var16 = true;
LAB_0024286f:
    DVar8 = DecodeMem(MI,uVar22,address,info,_Var16,DecodeRD);
LAB_00242874:
    iVar21 = local_44;
    if (DVar8 == MCDisassembler_Fail) {
      iVar21 = 0;
    }
    goto LAB_00242b12;
  case 0x42:
    DecodeRD = DecodeFPRegsRegisterClass;
    goto LAB_002425bd;
  case 0x43:
    DecodeRD = DecodeQFPRegsRegisterClass;
    goto LAB_002425bd;
  case 0x44:
    DecodeRD = DecodeDFPRegsRegisterClass;
LAB_002425bd:
    _Var16 = false;
    goto LAB_0024286f;
  case 0x45:
  case 0x46:
    uVar23 = *(uint *)((long)IntRegDecoderTable + (ulong)((uVar23 & 0x3e000000) >> 0x17));
    MCOperand_CreateReg0(MI,uVar23);
    MCOperand_CreateReg0
              (MI,*(uint *)((long)IntRegDecoderTable + (ulong)((uVar15 & 0x7c000) >> 0xc)));
    MCOperand_CreateReg0(MI,IntRegDecoderTable[uVar2 & 0x1f]);
LAB_00242b08:
    MCOperand_CreateReg0(MI,uVar23);
    goto switchD_002420c0_caseD_4;
  }
LAB_00242abf:
  MCOperand_CreateImm0(MI,uVar12);
switchD_002420c0_caseD_4:
  iVar21 = local_44;
LAB_00242b12:
  if (iVar21 == 0) {
LAB_00242b25:
    _Var16 = false;
  }
  else {
    *size = 4;
    _Var16 = true;
  }
  return _Var16;
}

Assistant:

bool Sparc_getInstruction(csh ud, const uint8_t *code, size_t code_len, MCInst *MI,
		uint16_t *size, uint64_t address, void *info)
{
	uint32_t Insn;
	DecodeStatus Result;
	
	Result = readInstruction32(code, code_len, &Insn);
	if (Result == MCDisassembler_Fail)
		return false;

	if (MI->flat_insn->detail) {
		memset(MI->flat_insn->detail, 0, offsetof(cs_detail, sparc)+sizeof(cs_sparc));
	}

	Result = decodeInstruction_4(DecoderTableSparc32, MI, Insn, address,
			(MCRegisterInfo *)info, 0);
	if (Result != MCDisassembler_Fail) {
		*size = 4;
		return true;
	}

	return false;
}